

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileLibraryTargetGenerator::WriteRuleFiles(cmMakefileLibraryTargetGenerator *this)

{
  bool bVar1;
  
  cmMakefileTargetGenerator::CreateRuleFile(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteCommonCodeRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetLanguageFlags(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetBuildRules(&this->super_cmMakefileTargetGenerator);
  switch(((this->super_cmMakefileTargetGenerator).Target)->TargetTypeValue) {
  case STATIC_LIBRARY:
    WriteStaticLibraryRules(this);
    break;
  case SHARED_LIBRARY:
    WriteSharedLibraryRules(this,false);
    bVar1 = cmTarget::NeedRelinkBeforeInstall
                      ((this->super_cmMakefileTargetGenerator).Target,
                       &(this->super_cmMakefileTargetGenerator).ConfigName);
    if (bVar1) {
      WriteSharedLibraryRules(this,true);
    }
    break;
  case MODULE_LIBRARY:
    WriteModuleLibraryRules(this,false);
    bVar1 = cmTarget::NeedRelinkBeforeInstall
                      ((this->super_cmMakefileTargetGenerator).Target,
                       &(this->super_cmMakefileTargetGenerator).ConfigName);
    if (bVar1) {
      WriteModuleLibraryRules(this,true);
    }
    break;
  case OBJECT_LIBRARY:
    WriteObjectLibraryRules(this);
    break;
  default:
    cmSystemTools::Error("Unknown Library Type",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  cmMakefileTargetGenerator::WriteTargetRequiresRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetCleanRules(&this->super_cmMakefileTargetGenerator);
  cmMakefileTargetGenerator::WriteTargetDependRules(&this->super_cmMakefileTargetGenerator);
  (*(this->super_cmMakefileTargetGenerator)._vptr_cmMakefileTargetGenerator[4])(this);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteRuleFiles()
{
  // create the build.make file and directory, put in the common blocks
  this->CreateRuleFile();

  // write rules used to help build object files
  this->WriteCommonCodeRules();

  // write the per-target per-language flags
  this->WriteTargetLanguageFlags();

  // write in rules for object files and custom commands
  this->WriteTargetBuildRules();

  // write the link rules
  // Write the rule for this target type.
  switch(this->Target->GetType())
    {
    case cmTarget::STATIC_LIBRARY:
      this->WriteStaticLibraryRules();
      break;
    case cmTarget::SHARED_LIBRARY:
      this->WriteSharedLibraryRules(false);
      if(this->Target->NeedRelinkBeforeInstall(this->ConfigName))
        {
        // Write rules to link an installable version of the target.
        this->WriteSharedLibraryRules(true);
        }
      break;
    case cmTarget::MODULE_LIBRARY:
      this->WriteModuleLibraryRules(false);
      if(this->Target->NeedRelinkBeforeInstall(this->ConfigName))
        {
        // Write rules to link an installable version of the target.
        this->WriteModuleLibraryRules(true);
        }
      break;
    case cmTarget::OBJECT_LIBRARY:
      this->WriteObjectLibraryRules();
      break;
    default:
      // If language is not known, this is an error.
      cmSystemTools::Error("Unknown Library Type");
      break;
    }

  // Write the requires target.
  this->WriteTargetRequiresRules();

  // Write clean target
  this->WriteTargetCleanRules();

  // Write the dependency generation rule.  This must be done last so
  // that multiple output pair information is available.
  this->WriteTargetDependRules();

  // close the streams
  this->CloseFileStreams();
}